

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::inf_or_nan_writer::operator()
          (inf_or_nan_writer *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  type tVar1;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *in_RSI;
  char *in_RDI;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *in_stack_ffffffffffffffd0;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> in_stack_ffffffffffffffd8;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> local_20;
  char local_11;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *local_10;
  
  local_10 = in_RSI;
  if (*in_RDI != '\0') {
    local_11 = *in_RDI;
    local_20 = std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>::
               operator++(in_RSI,0);
    std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>::operator*
              (&local_20);
    std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>::operator=
              (in_stack_ffffffffffffffd0,in_RDI);
  }
  tVar1 = internal::
          copy_str<char,char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    ((char *)local_10->container,in_RDI,in_stack_ffffffffffffffd8);
  local_10->container = tVar1.container;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (sign)
        *it++ = static_cast<char_type>(sign);
      it = internal::copy_str<char_type>(
            str, str + static_cast<std::size_t>(INF_SIZE), it);
    }